

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.cpp
# Opt level: O0

oraddr_t __thiscall IMMU::immu_translate(IMMU *this,oraddr_t virtaddr)

{
  uorreg_t *puVar1;
  uint *local_38;
  uorreg_t *itlbmr_lru;
  uorreg_t *itlbmr;
  uorreg_t *itlbtr;
  int i;
  oraddr_t virtaddr_local;
  IMMU *this_local;
  
  if (((((this->super_MMU).cpu)->sprs[0x11] & 0x40) == 0) ||
     ((((this->super_MMU).cpu)->sprs[1] & 0x10) == 0)) {
    this->insn_ci = (uint)(0x7fffffff < virtaddr);
    this_local._4_4_ = virtaddr;
  }
  else {
    itlbtr._4_4_ = virtaddr;
    _i = this;
    puVar1 = immu_find_tlbmr(this,virtaddr,&local_38);
    if (puVar1 == (uorreg_t *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      for (itlbtr._0_4_ = 0; (int)itlbtr < (this->super_MMU).nways; itlbtr._0_4_ = (int)itlbtr + 1)
      {
        if ((*local_38 & 0xc0) != 0) {
          *local_38 = *local_38 & 0xffffff3f | (*local_38 & 0xc0) - 0x40;
        }
        local_38 = local_38 + 0x100;
      }
      *puVar1 = (this->super_MMU).lru_reload | *puVar1;
      this->insn_ci = puVar1[0x80] & 2;
      this_local._4_4_ =
           puVar1[0x80] & 0xffffe000 | itlbtr._4_4_ & (this->super_MMU).page_offset_mask;
    }
  }
  return this_local._4_4_;
}

Assistant:

oraddr_t IMMU::immu_translate(oraddr_t virtaddr)
{
    int i;
    uorreg_t *itlbtr;
    uorreg_t *itlbmr;
    uorreg_t *itlbmr_lru;

    //disable mmu
    if (!(cpu->sprs[SPR_SR] & SPR_SR_IME) ||
        !(cpu->sprs[SPR_UPR] & SPR_UPR_IMP))
    {
        insn_ci = (virtaddr >= 0x80000000);
        return virtaddr;
    }

    itlbmr = immu_find_tlbmr(virtaddr, &itlbmr_lru);

    if (itlbmr)
    {
        itlbtr = itlbmr + 128;

        /* Set LRUs */
        /*
         * every itlbmr have distance of 256.
         * every itlbmr have 128 in maximum.
        */
        for (i = 0; i < nways; i++, itlbmr_lru += (128 * 2))
        {
            //LRU 7-6
            if (*itlbmr_lru & SPR_ITLBMR_LRU)
                *itlbmr_lru = (*itlbmr_lru & ~SPR_ITLBMR_LRU) |
                              ((*itlbmr_lru & SPR_ITLBMR_LRU) - 0x40);
        }

        *itlbmr |= lru_reload;

        /* Check if page is cache inhibited */
        insn_ci = *itlbtr & SPR_ITLBTR_CI;

        //itlbtr's PPM + (virtaddr & page_offset_mask)
        return (*itlbtr & SPR_ITLBTR_PPN) | (virtaddr & page_offset_mask);
    }

    //TODO:
    //except_handle(EXCEPT_ITLBMISS, virtaddr);

    return 0;
}